

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regvalue.h
# Opt level: O1

string * __thiscall
RegistryValue::DwordAsString_abi_cxx11_(string *__return_storage_ptr__,RegistryValue *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint *puVar3;
  uint *puVar4;
  uint8_t *first;
  StringList *this_00;
  undefined8 *puVar5;
  string *__return_storage_ptr___00;
  undefined8 uVar6;
  value_type local_80;
  string local_60;
  string local_40;
  
  if (this->m_dwType != 4) {
    __return_storage_ptr___00 = (string *)__cxa_allocate_exception(0x20);
    stringformat_abi_cxx11_
              (__return_storage_ptr___00,"DwordAsString: not a dword: %d",(ulong)this->m_dwType);
    __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                std::__cxx11::string::~string);
  }
  puVar3 = (uint *)(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (uint *)(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
  if ((long)puVar4 - (long)puVar3 == 4) {
    stringformat_abi_cxx11_(__return_storage_ptr__,"dword:%08lx",(ulong)*puVar3);
    return __return_storage_ptr__;
  }
  if (puVar4 == puVar3) {
    stringformat_abi_cxx11_(__return_storage_ptr__,"dword:");
    return __return_storage_ptr__;
  }
  stringformat_abi_cxx11_(&local_80,"DwordAsString: invalid sized dword: %d");
  this_00 = W_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_80);
  paVar2 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  stringformat_abi_cxx11_(&local_80,"hex(%d):",(ulong)this->m_dwType);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  first = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  ascdump(&local_60,first,
          (long)(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)first,&local_40,false);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    uVar6 = local_80.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_60._M_string_length + local_80._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar6 = local_60.field_2._M_allocated_capacity;
    }
    if (local_60._M_string_length + local_80._M_string_length <= (ulong)uVar6) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_60,0,(char *)0x0,(ulong)local_80._M_dataplus._M_p);
      goto LAB_00112322;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60._M_dataplus._M_p);
LAB_00112322:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar6 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DwordAsString() const
    {
            if (m_dwType!=REG_DWORD) throw stringformat("DwordAsString: not a dword: %d", m_dwType);
            if (m_data.size()==0)
                    return stringformat("dword:");
            else if (m_data.size()!=sizeof(uint32_t)) {
        warn(stringformat("DwordAsString: invalid sized dword: %d", m_data.size()));
                    return stringformat("hex(%d):", m_dwType)+ascdump(m_data);
            }
            return stringformat("dword:%08lx", get32le(m_data.begin()));
    }